

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ord_hash_set.h
# Opt level: O0

elem_t * __thiscall
re2c::ord_hash_set_t::make_elem
          (ord_hash_set_t *this,elem_t *next,size_t index,size_t size,void *data)

{
  elem_t *peVar1;
  elem_t *e;
  void *data_local;
  size_t size_local;
  size_t index_local;
  elem_t *next_local;
  ord_hash_set_t *this_local;
  
  peVar1 = (elem_t *)malloc(size + 0x18);
  peVar1->next = next;
  peVar1->index = index;
  peVar1->size = size;
  memcpy(peVar1->data,data,size);
  return peVar1;
}

Assistant:

ord_hash_set_t::elem_t* ord_hash_set_t::make_elem(
	elem_t *next,
	size_t index,
	size_t size,
	const void *data)
{
	elem_t *e = static_cast<elem_t*>(malloc(offsetof(elem_t, data) + size));
	e->next = next;
	e->index = index;
	e->size = size;
	memcpy(e->data, data, size);
	return e;
}